

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_tree_renderer.cpp
# Opt level: O1

void __thiscall
duckdb::HTMLTreeRenderer::ToStreamInternal(HTMLTreeRenderer *this,RenderTree *root,ostream *ss)

{
  undefined1 *puVar1;
  size_type sVar2;
  undefined1 **ppuVar3;
  pointer __dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  idx_t in_R8;
  string head_section;
  size_type __dnew;
  string result;
  size_type __dnew_1;
  undefined1 **local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8 [2];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  string local_98;
  string local_78;
  char *local_58;
  long local_50;
  char local_48 [16];
  size_type local_38;
  
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = '\0';
  local_d8 = local_c8;
  local_b8[0] = (undefined1 *)0x11b;
  ppuVar3 = (undefined1 **)::std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)local_b8);
  puVar1 = local_b8[0];
  local_c8[0] = local_b8[0];
  local_d8 = ppuVar3;
  switchD_015ff80e::default
            (ppuVar3,
             "\n<!DOCTYPE html>\n<html lang=\"en\">\n<head>\n    <meta charset=\"UTF-8\">\n    <meta name=\"viewport\" content=\"width=device-width, initial-scale=1.0\">\n    <link rel=\"stylesheet\" href=\"https://unpkg.com/treeflex/dist/css/treeflex.css\">\n    <title>DuckDB Query Plan</title>\n    %s\n</head>\n    "
             ,0x11b);
  local_d0 = puVar1;
  *(undefined1 *)((long)ppuVar3 + (long)puVar1) = 0;
  local_b8[0] = local_a8;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_b8,local_d8,puVar1 + (long)local_d8);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_38 = 0x7c9;
  __dest = (pointer)::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_38);
  sVar2 = local_38;
  local_98.field_2._M_allocated_capacity = local_38;
  local_98._M_dataplus._M_p = __dest;
  switchD_015ff80e::default
            (__dest,
             "\n    <style>\n        body {\n            font-family: Arial, sans-serif;\n        }\n\n        .tf-tree .tf-nc {\n            padding: 0px;\n            border: 1px solid #E5E5E5;\n        }\n\n        .tf-nc {\n            border-radius: 0.5rem;\n            padding: 0px;\n            min-width: 150px;\n            width: auto;\n            background-color: #FAFAFA;\n            text-align: center;\n            position: relative;\n        }\n\n        .collapse_button {\n            position:relative;\n            color: black;\n            z-index: 2;\n            width: 2em;\n            background-color: white;\n            height: 2em;\n            border-radius: 50%;\n            top: 2.25em;\n        }\n\n        .collapse_button:hover {\n            background-color: #f0f0f0; /* Light gray */\n        }\n\n        .collapse_button:active {\n            background-color: #e0e0e0; /* Slightly darker gray */\n        }\n\n        .hidden {\n            display: none !important;\n        }\n\n        .title {\n            font-weight: bold;\n            padding-bottom: 5px;\n            color: #fff100;\n            box-sizing: border-box;\n            background-color: black;\n            border-top-left-radius: 0.5rem;\n            border-top-right-radius: 0.5rem;\n            padding: 10px;\n        }\n\n        .content {\n            border-top: 1px solid #000;\n            text-align: center;\n            border-bottom-left-radius: 0.5rem;\n            border-bottom-right-radius: 0.5rem;\n            padding: 10px;\n        }\n\n        .sub-title {\n            color: black;\n            font-weight: bold;\n            padding-top: 5px;\n        }\n\n        .sub-title:not(:first-child) {\n            border-top: 1px solid #ADADAD;\n        }\n\n        .value {\n            margin-left: 10px;\n            margin-top: 5px;\n            color: #3B3B3B;\n            margin-bottom: 5px;\n        }\n\n        .tf-tree {\n            width: 100%;\n            height: 100%;\n            overflow: visible;\n        }\n    </style>\n    "
             ,0x7c9);
  local_98._M_string_length = sVar2;
  __dest[sVar2] = '\0';
  StringUtil::Format<std::__cxx11::string>(&local_78,(StringUtil *)local_b8,&local_98,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  ::std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_d8 = local_c8;
  local_b8[0] = (undefined1 *)0x24e;
  ppuVar3 = (undefined1 **)::std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)local_b8);
  puVar1 = local_b8[0];
  local_c8[0] = local_b8[0];
  local_d8 = ppuVar3;
  switchD_015ff80e::default
            (ppuVar3,
             "\n<body>\n    <div class=\"tf-tree\">\n        <ul>%s</ul>\n    </div>\n\n<script>\nfunction toggleDisplay(button) {\n    const parentLi = button.closest(\'li\');\n    const nestedUl = parentLi.querySelector(\'ul\');\n    if (nestedUl) {\n        const currentDisplay = getComputedStyle(nestedUl).getPropertyValue(\'display\');\n        if (currentDisplay === \'none\') {\n            nestedUl.classList.toggle(\'hidden\');\n            button.textContent = \'-\';\n        } else {\n            nestedUl.classList.toggle(\'hidden\');\n            button.textContent = \'+\';\n        }\n    }\n}\n</script>\n\n</body>\n</html>\n    "
             ,0x24e);
  local_d0 = puVar1;
  *(undefined1 *)((long)ppuVar3 + (long)puVar1) = 0;
  local_b8[0] = local_a8;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_b8,local_d8,puVar1 + (long)local_d8);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  CreateTreeRecursive_abi_cxx11_(&local_98,(duckdb *)root,(RenderTree *)0x0,0,in_R8);
  StringUtil::Format<std::__cxx11::string>(&local_78,(StringUtil *)local_b8,&local_98,params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  ::std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(ss,local_58,local_50);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void HTMLTreeRenderer::ToStreamInternal(RenderTree &root, std::ostream &ss) {
	string result;
	result += CreateHeadSection(root);
	result += CreateBodySection(root);
	ss << result;
}